

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::SetCachedSize(Message *this,int size)

{
  LogMessage *pLVar1;
  Descriptor *this_00;
  string *value;
  LogFinisher local_5d [13];
  LogMessage local_50;
  int local_14;
  Message *pMStack_10;
  int size_local;
  Message *this_local;
  
  local_14 = size;
  pMStack_10 = this;
  internal::LogMessage::LogMessage
            (&local_50,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/message.cc"
             ,0x99);
  pLVar1 = internal::LogMessage::operator<<(&local_50,"Message class \"");
  this_00 = GetDescriptor(this);
  value = Descriptor::full_name_abi_cxx11_(this_00);
  pLVar1 = internal::LogMessage::operator<<(pLVar1,value);
  pLVar1 = internal::LogMessage::operator<<
                     (pLVar1,
                      "\" implements neither SetCachedSize() nor ByteSize().  Must implement one or the other."
                     );
  internal::LogFinisher::operator=(local_5d,pLVar1);
  internal::LogMessage::~LogMessage(&local_50);
  return;
}

Assistant:

void Message::SetCachedSize(int size) const {
  GOOGLE_LOG(FATAL) << "Message class \"" << GetDescriptor()->full_name()
             << "\" implements neither SetCachedSize() nor ByteSize().  "
                "Must implement one or the other.";
}